

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isWellFormedIPv4Address(XMLCh *addr,XMLSize_t length)

{
  bool bVar1;
  XMLCh last;
  XMLCh second;
  ulong uStack_30;
  XMLCh first;
  XMLSize_t i;
  int numDigits;
  int numDots;
  XMLSize_t length_local;
  XMLCh *addr_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  uStack_30 = 0;
  do {
    if (length <= uStack_30) {
      return i._4_4_ == 3;
    }
    if (addr[uStack_30] == L'.') {
      if (((uStack_30 == 0) || (uStack_30 + 1 == length)) ||
         (bVar1 = XMLString::isDigit(addr[uStack_30 + 1]), !bVar1)) {
        return false;
      }
      i._0_4_ = 0;
      i._4_4_ = i._4_4_ + 1;
      if (3 < i._4_4_) {
        return false;
      }
    }
    else {
      bVar1 = XMLString::isDigit(addr[uStack_30]);
      if (!bVar1) {
        return false;
      }
      i._0_4_ = (int)i + 1;
      if (3 < (int)i) {
        return false;
      }
      if ((int)i == 3) {
        if ((0x31 < (ushort)addr[uStack_30 - 2]) &&
           ((addr[uStack_30 - 2] != L'2' ||
            ((0x34 < (ushort)addr[uStack_30 - 1] &&
             ((addr[uStack_30 - 1] != L'5' || (0x35 < (ushort)addr[uStack_30])))))))) {
          return false;
        }
      }
    }
    uStack_30 = uStack_30 + 1;
  } while( true );
}

Assistant:

bool XMLUri::isWellFormedIPv4Address(const XMLCh* const addr, const XMLSize_t length)
{
    int numDots = 0;
    int numDigits = 0;

    // IPv4address = 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT
    //
    // make sure that
    // 1) we see only digits and dot separators,
    // 2) that any dot separator is preceded and followed by a digit
    // 3) that we find 3 dots
    // 4) that each segment contains 1 to 3 digits.
    // 5) that each segment is not greater than 255.
    for (XMLSize_t i = 0; i < length; ++i)
    {
        if (addr[i] == chPeriod)
        {
            if ((i == 0) ||
                (i+1 == length) ||
                !XMLString::isDigit(addr[i+1]))
            {
               return false;
            }
            numDigits = 0;
            if (++numDots > 3)
                return false;
        }
        else if (!XMLString::isDigit(addr[i]))
        {
            return false;
        }
        // Check that that there are no more than three digits
        // in this segment.
        else if (++numDigits > 3)
        {
            return false;
        }
        // Check that this segment is not greater than 255.
        else if (numDigits == 3)
        {
            XMLCh first = addr[i-2];
            XMLCh second = addr[i-1];
            XMLCh last = addr[i];
            if (!(first < chDigit_2 ||
                 (first == chDigit_2 &&
                 (second < chDigit_5 ||
                 (second == chDigit_5 && last <= chDigit_5)))))
            {
                return false;
            }
        }
    } //for
    return (numDots == 3);
}